

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,NameExpNode *nameExpNode)

{
  TokenNode *pTVar1;
  ExpNode *pEVar2;
  VarSymbol *pVVar3;
  
  pTVar1 = nameExpNode->id;
  if (pTVar1 == (TokenNode *)0x0) {
    visit((SemanticTypes *)nameExpNode);
  }
  else {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
    pEVar2 = nameExpNode->exp;
    if (pEVar2 == (ExpNode *)0x0) {
      visit((SemanticTypes *)0x0);
    }
    else {
      (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
      pEVar2 = nameExpNode->exp;
      if ((pEVar2->pointer == false) && (pEVar2->arraySize < 1)) {
        pVVar3 = VarTable::searchInScope
                           (varTable,(nameExpNode->id->super_ExpNode).lexeme,pEVar2->typeLexeme);
        if (pVVar3 == (VarSymbol *)0x0) {
          visit();
        }
        else {
          pTVar1 = pVVar3->type->id;
          (nameExpNode->super_ExpNode).type = pTVar1->token;
          (nameExpNode->super_ExpNode).typeLexeme = (pTVar1->super_ExpNode).typeLexeme;
          (nameExpNode->super_ExpNode).pointer = pVVar3->pointer;
          (nameExpNode->super_ExpNode).arraySize = pVVar3->arraySize;
          (nameExpNode->super_ExpNode).lValue = true;
        }
      }
      else {
        visit((SemanticTypes *)pEVar2);
      }
    }
  }
  return;
}

Assistant:

void SemanticTypes::visit(NameExpNode *nameExpNode) {
    if (nameExpNode->getId()) {
        nameExpNode->getId()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - nameExpNode] NO RECORD ACCESS EXPRESSION, line %d\n",
                nameExpNode->getExp()->getLine());
        return;
    }

    if (nameExpNode->getExp()) {
        nameExpNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - nameExpNode] NO STRUCT ACCESS FIELD, line %d\n",
                nameExpNode->getExp()->getLine());
        return;
    }

    if (nameExpNode->getExp()->isPointer() || nameExpNode->getExp()->getArraySize() > 0) {
        fprintf(stderr, "[SEMANTIC ERROR - nameExpNode] INCORRECT ACCESS TO A STRUCT, line %d\n",
                nameExpNode->getExp()->getLine());
        return;
    }
    VarSymbol *recordField = varTable->searchInScope(nameExpNode->getId()->getLexeme(),
                                                     nameExpNode->getExp()->getTypeLexeme());

    if (!recordField) {
        fprintf(stderr, "[SEMANTIC ERROR - nameExpNode] UNKNOWN FIELD IN STRUCT, line: %d field: %s type: %s\n",
                nameExpNode->getExp()->getLine(), nameExpNode->getId()->getLexeme(),
                nameExpNode->getExp()->getTypeLexeme());
        return;
    }

    nameExpNode->setType(recordField->getType()->getType());
    nameExpNode->setTypeLexeme(recordField->getType()->getTypeLexeme());
    nameExpNode->setPointer(recordField->isPointer());
    nameExpNode->setArraySize(recordField->getArraySize());
    nameExpNode->setLValue(true);
}